

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

bool __thiscall
DCanvas::ParseDrawTextureTags
          (DCanvas *this,FTexture *img,double x,double y,DWORD tag,__va_list_tag *tags,
          DrawParms *parms,bool fortext)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  DWORD *local_568;
  int *local_550;
  int *local_538;
  int *local_520;
  undefined8 *local_508;
  undefined8 *local_4f0;
  FRenderStyle *local_4d8;
  INTBOOL *local_4c0;
  INTBOOL *local_4a8;
  INTBOOL *local_490;
  int *local_478;
  int *local_460;
  int *local_448;
  int *local_430;
  int *local_418;
  int *local_400;
  int *local_3e8;
  double *local_3d0;
  int *local_3b0;
  double *local_398;
  int *local_378;
  int *local_360;
  int *local_348;
  double *local_330;
  int *local_310;
  double *local_2f8;
  int *local_2d8;
  INTBOOL *local_2c0;
  uint32 *local_2a8;
  undefined8 *local_290;
  uint32 *local_278;
  INTBOOL *local_260;
  double *local_248;
  int *local_228;
  int *local_210;
  double *local_1f8;
  int *local_1d8;
  double *local_1c0;
  int *local_1a0;
  int *local_188;
  int *local_170;
  int *local_158;
  int *local_140;
  int *local_128;
  int *local_110;
  double *local_f8;
  int *local_d8;
  double *local_c0;
  int *local_a0;
  DWORD data;
  bool fillcolorset;
  bool translationset;
  int intval;
  INTBOOL boolval;
  bool fortext_local;
  DrawParms *parms_local;
  __va_list_tag *tags_local;
  DWORD tag_local;
  double y_local;
  double x_local;
  FTexture *img_local;
  DCanvas *this_local;
  
  bVar2 = false;
  if ((fortext) || ((img != (FTexture *)0x0 && (img->UseType != '\r')))) {
    if ((x < -16383.0) || (((16383.0 < x || (y < -16383.0)) || (16383.0 < y)))) {
      this_local._7_1_ = false;
    }
    else {
      parms->fortext = fortext;
      parms->windowleft = 0.0;
      parms->windowright = 2147483647.0;
      iVar3 = GetHeight(this);
      parms->dclip = iVar3;
      parms->uclip = 0;
      parms->lclip = 0;
      iVar3 = GetWidth(this);
      parms->rclip = iVar3;
      parms->left = 2147483647.0;
      parms->top = 2147483647.0;
      parms->destwidth = 2147483647.0;
      parms->destheight = 2147483647.0;
      parms->Alpha = 1.0;
      parms->fillcolor = 0xffffffff;
      parms->remap = (FRemapTable *)0x0;
      parms->colorOverlay = 0;
      parms->alphaChannel = 0;
      parms->flipX = 0;
      parms->shadowAlpha = 0;
      parms->shadowColor = 0;
      iVar3 = GetWidth(this);
      parms->virtWidth = (double)iVar3;
      iVar3 = GetHeight(this);
      parms->virtHeight = (double)iVar3;
      parms->keepratio = 0;
      (parms->style).field_0.BlendOp = 0xff;
      parms->masked = 1;
      parms->bilinear = 0;
      parms->specialcolormap = (FSpecialColormap *)0x0;
      parms->colormapstyle = (FColormapStyle *)0x0;
      parms->cleanmode = 0x40001388;
      parms->scaley = 1;
      parms->scalex = 1;
      parms->celly = 0;
      parms->cellx = 0;
      parms->maxstrlen = 0x7fffffff;
      parms->virtBottom = false;
      tags_local._4_4_ = tag;
      while (tags_local._4_4_ != 0) {
        switch(tags_local._4_4_) {
        case 0x40001389:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x1e2,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          parms->cleanmode = 0x40001388;
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_a0 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_a0 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_a0 + 2;
          }
          parms->destwidth = (double)*local_a0;
          break;
        case 0x4000138a:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x1f0,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          parms->cleanmode = 0x40001388;
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_d8 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_d8 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_d8 + 2;
          }
          parms->destheight = (double)*local_d8;
          break;
        case 0x4000138b:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_228 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_228 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_228 + 2;
          }
          iVar3 = MIN<int>(0x10000,*local_228);
          dVar5 = FixedToFloat(iVar3);
          parms->Alpha = (float)dVar5;
          break;
        case 0x4000138c:
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_248 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_248 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_248 + 1;
          }
          dVar5 = MIN<double>(1.0,*local_248);
          parms->Alpha = (float)dVar5;
          break;
        case 0x4000138d:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_278 = (uint32 *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_278 = (uint32 *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_278 + 2;
          }
          parms->fillcolor = *local_278;
          bVar2 = true;
          break;
        case 0x4000138e:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_290 = (undefined8 *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_290 = (undefined8 *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_290 + 1;
          }
          parms->remap = (FRemapTable *)*local_290;
          if ((parms->remap != (FRemapTable *)0x0) && ((parms->remap->Inactive & 1U) != 0)) {
            parms->remap = (FRemapTable *)0x0;
          }
          break;
        case 0x4000138f:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_260 = (INTBOOL *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_260 = (INTBOOL *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_260 + 2;
          }
          parms->alphaChannel = *local_260;
          break;
        case 0x40001390:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_110 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_110 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_110 + 2;
          }
          if (*local_110 != 0) {
            parms->scalex = 1;
            parms->scaley = 1;
            parms->cleanmode = tags_local._4_4_;
          }
          break;
        case 0x40001391:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_158 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_158 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_158 + 2;
          }
          if (*local_158 != 0) {
            parms->cleanmode = 0x40001388;
            parms->scalex = 1;
            parms->scaley = 1;
            parms->virtWidth = 320.0;
            parms->virtHeight = 200.0;
          }
          break;
        case 0x40001392:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_170 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_170 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_170 + 2;
          }
          if (*local_170 != 0) {
            parms->cleanmode = 0x40001388;
            parms->scalex = 1;
            parms->scaley = 1;
            parms->virtWidth = 320.0;
            parms->virtHeight = 200.0;
          }
          parms->virtBottom = true;
          break;
        case 0x40001393:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_128 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_128 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_128 + 2;
          }
          if (*local_128 != 0) {
            parms->scalex = CleanXfac;
            parms->scaley = CleanYfac;
            parms->cleanmode = tags_local._4_4_;
          }
          break;
        case 0x40001394:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_140 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_140 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_140 + 2;
          }
          if (*local_140 != 0) {
            parms->scalex = CleanXfac_1;
            parms->scaley = CleanYfac_1;
            parms->cleanmode = tags_local._4_4_;
          }
          break;
        case 0x40001395:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_2c0 = (INTBOOL *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_2c0 = (INTBOOL *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_2c0 + 2;
          }
          parms->flipX = *local_2c0;
          break;
        case 0x40001396:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_460 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_460 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_460 + 2;
          }
          parms->shadowColor = *local_460;
          break;
        case 0x40001397:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_448 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_448 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_448 + 2;
          }
          iVar3 = MIN<int>(0x10000,*local_448);
          parms->shadowAlpha = iVar3;
          break;
        case 0x40001398:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_478 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_478 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_478 + 2;
          }
          if (*local_478 == 0) {
            parms->shadowAlpha = 0;
          }
          else {
            parms->shadowAlpha = 0x8000;
            parms->shadowColor = 0;
          }
          break;
        case 0x40001399:
          parms->cleanmode = 0x40001388;
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_1a0 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_1a0 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_1a0 + 2;
          }
          parms->virtWidth = (double)*local_1a0;
          break;
        case 0x4000139a:
          parms->cleanmode = 0x40001388;
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_1d8 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_1d8 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_1d8 + 2;
          }
          parms->virtHeight = (double)*local_1d8;
          break;
        case 0x4000139b:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x27b,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_2d8 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_2d8 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_2d8 + 2;
          }
          parms->top = (double)*local_2d8;
          break;
        case 0x4000139c:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x287,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_310 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_310 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_310 + 2;
          }
          parms->left = (double)*local_310;
          break;
        case 0x4000139d:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x293,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_348 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_348 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_348 + 2;
          }
          if (*local_348 != 0) {
            dVar5 = FTexture::GetScaledWidthDouble(img);
            parms->left = dVar5 * 0.5;
            dVar5 = FTexture::GetScaledHeightDouble(img);
            parms->top = dVar5 * 0.5;
          }
          break;
        case 0x4000139e:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x29d,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_360 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_360 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_360 + 2;
          }
          if (*local_360 != 0) {
            dVar5 = FTexture::GetScaledWidthDouble(img);
            parms->left = dVar5 * 0.5;
            dVar5 = FTexture::GetScaledHeightDouble(img);
            parms->top = dVar5;
          }
          break;
        case 0x4000139f:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x2a7,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_378 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_378 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_378 + 2;
          }
          parms->windowleft = (double)*local_378;
          break;
        case 0x400013a0:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x2b3,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_3b0 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_3b0 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_3b0 + 2;
          }
          parms->windowright = (double)*local_3b0;
          break;
        case 0x400013a1:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_3e8 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_3e8 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_3e8 + 2;
          }
          parms->uclip = *local_3e8;
          if (parms->uclip < 0) {
            parms->uclip = 0;
          }
          break;
        case 0x400013a2:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_400 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_400 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_400 + 2;
          }
          parms->dclip = *local_400;
          iVar3 = parms->dclip;
          iVar4 = GetHeight(this);
          if (iVar4 < iVar3) {
            iVar3 = GetHeight(this);
            parms->dclip = iVar3;
          }
          break;
        case 0x400013a3:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_418 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_418 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_418 + 2;
          }
          parms->lclip = *local_418;
          if (parms->lclip < 0) {
            parms->lclip = 0;
          }
          break;
        case 0x400013a4:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_430 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_430 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_430 + 2;
          }
          parms->rclip = *local_430;
          iVar3 = parms->rclip;
          iVar4 = GetWidth(this);
          if (iVar4 < iVar3) {
            iVar3 = GetWidth(this);
            parms->rclip = iVar3;
          }
          break;
        case 0x400013a5:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_490 = (INTBOOL *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_490 = (INTBOOL *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_490 + 2;
          }
          parms->masked = *local_490;
          break;
        case 0x400013a6:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_188 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_188 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_188 + 2;
          }
          iVar3 = 0x400013a6;
          if (*local_188 == 1) {
            iVar3 = 0x400013a7;
          }
          parms->cleanmode = iVar3;
          break;
        default:
          if (tags->gp_offset < 0x29) {
            tags->gp_offset = tags->gp_offset + 8;
          }
          else {
            tags->overflow_arg_area = (void *)((long)tags->overflow_arg_area + 8);
          }
          break;
        case 0x400013a8:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_4c0 = (INTBOOL *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_4c0 = (INTBOOL *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_4c0 + 2;
          }
          parms->keepratio = *local_4c0;
          break;
        case 0x400013a9:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_4d8 = (FRenderStyle *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_4d8 = (FRenderStyle *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_4d8 + 2;
          }
          parms->style = *local_4d8;
          break;
        case 0x400013aa:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_2a8 = (uint32 *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_2a8 = (uint32 *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_2a8 + 2;
          }
          parms->colorOverlay = *local_2a8;
          break;
        case 0x400013ab:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_4a8 = (INTBOOL *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_4a8 = (INTBOOL *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_4a8 + 2;
          }
          parms->bilinear = *local_4a8;
          break;
        case 0x400013ac:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_4f0 = (undefined8 *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_4f0 = (undefined8 *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_4f0 + 1;
          }
          parms->specialcolormap = (FSpecialColormap *)*local_4f0;
          break;
        case 0x400013ad:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_508 = (undefined8 *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_508 = (undefined8 *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_508 + 1;
          }
          parms->colormapstyle = (FColormapStyle *)*local_508;
          break;
        case 0x400013ae:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_210 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_210 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_210 + 2;
          }
          if (*local_210 != 0) {
            if (fortext) {
              __assert_fail("fortext == false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                            ,0x251,
                            "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                           );
            }
            if (img == (FTexture *)0x0) {
              return false;
            }
            parms->cleanmode = 0x400013ae;
            dVar5 = FTexture::GetScaledWidthDouble(img);
            parms->virtWidth = dVar5;
            dVar5 = FTexture::GetScaledHeightDouble(img);
            parms->virtHeight = dVar5;
          }
          break;
        case 0x400013af:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x1e9,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          parms->cleanmode = 0x40001388;
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_c0 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_c0 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_c0 + 1;
          }
          parms->destwidth = *local_c0;
          break;
        case 0x400013b0:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x1f7,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          parms->cleanmode = 0x40001388;
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_f8 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_f8 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_f8 + 1;
          }
          parms->destheight = *local_f8;
          break;
        case 0x400013b1:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x281,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_2f8 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_2f8 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_2f8 + 1;
          }
          parms->top = *local_2f8;
          break;
        case 0x400013b2:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x28d,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_330 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_330 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_330 + 1;
          }
          parms->left = *local_330;
          break;
        case 0x400013b3:
          parms->cleanmode = 0x40001388;
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_1c0 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_1c0 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_1c0 + 1;
          }
          parms->virtWidth = *local_1c0;
          break;
        case 0x400013b4:
          parms->cleanmode = 0x40001388;
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_1f8 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_1f8 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_1f8 + 1;
          }
          parms->virtHeight = *local_1f8;
          break;
        case 0x400013b5:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x2ad,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_398 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_398 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_398 + 1;
          }
          parms->windowleft = *local_398;
          break;
        case 0x400013b6:
          if (fortext) {
            __assert_fail("fortext == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                          ,0x2b9,
                          "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                         );
          }
          if (fortext) {
            return false;
          }
          uVar1 = tags->fp_offset;
          if (uVar1 < 0xa1) {
            local_3d0 = (double *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->fp_offset = uVar1 + 0x10;
          }
          else {
            local_3d0 = (double *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_3d0 + 1;
          }
          parms->windowright = *local_3d0;
          break;
        case 0x400013b7:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_520 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_520 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_520 + 2;
          }
          parms->maxstrlen = *local_520;
          break;
        case 0x400013b8:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_538 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_538 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_538 + 2;
          }
          parms->cellx = *local_538;
          break;
        case 0x400013b9:
          uVar1 = tags->gp_offset;
          if (uVar1 < 0x29) {
            local_550 = (int *)((long)(int)uVar1 + (long)tags->reg_save_area);
            tags->gp_offset = uVar1 + 8;
          }
          else {
            local_550 = (int *)tags->overflow_arg_area;
            tags->overflow_arg_area = local_550 + 2;
          }
          parms->celly = *local_550;
        }
        uVar1 = tags->gp_offset;
        if (uVar1 < 0x29) {
          local_568 = (DWORD *)((long)(int)uVar1 + (long)tags->reg_save_area);
          tags->gp_offset = uVar1 + 8;
        }
        else {
          local_568 = (DWORD *)tags->overflow_arg_area;
          tags->overflow_arg_area = local_568 + 2;
        }
        tags_local._4_4_ = *local_568;
      }
      if ((parms->uclip < parms->dclip) && (parms->lclip < parms->rclip)) {
        if ((img == (FTexture *)0x0) ||
           ((SetTextureParms(this,parms,img,x,y), 0.0 < parms->destwidth &&
            (0.0 < parms->destheight)))) {
          if ((parms->style).field_0.BlendOp == 0xff) {
            if (bVar2) {
              if (parms->alphaChannel == 0) {
                if (1.0 < parms->Alpha || parms->Alpha == 1.0) {
                  FRenderStyle::operator=((FRenderStyle *)&(parms->style).field_0,STYLE_Stencil);
                }
                else {
                  FRenderStyle::operator=
                            ((FRenderStyle *)&(parms->style).field_0,STYLE_TranslucentStencil);
                }
              }
              else {
                FRenderStyle::operator=((FRenderStyle *)&(parms->style).field_0,STYLE_Shaded);
              }
            }
            else if (1.0 < parms->Alpha || parms->Alpha == 1.0) {
              FRenderStyle::operator=((FRenderStyle *)&(parms->style).field_0,STYLE_Normal);
            }
            else {
              FRenderStyle::operator=((FRenderStyle *)&(parms->style).field_0,STYLE_Translucent);
            }
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DCanvas::ParseDrawTextureTags (FTexture *img, double x, double y, DWORD tag, va_list tags, DrawParms *parms, bool fortext) const
{
	INTBOOL boolval;
	int intval;
	bool translationset = false;
	bool fillcolorset = false;

	if (!fortext)
	{
		if (img == NULL || img->UseType == FTexture::TEX_Null)
		{
			va_end(tags);
			return false;
		}
	}

	// Do some sanity checks on the coordinates.
	if (x < -16383 || x > 16383 || y < -16383 || y > 16383)
	{
		va_end(tags);
		return false;
	}

	parms->fortext = fortext;
	parms->windowleft = 0;
	parms->windowright = INT_MAX;
	parms->dclip = this->GetHeight();
	parms->uclip = 0;
	parms->lclip = 0;
	parms->rclip = this->GetWidth();
	parms->left = INT_MAX;
	parms->top = INT_MAX;
	parms->destwidth = INT_MAX;
	parms->destheight = INT_MAX;
	parms->Alpha = 1.f;
	parms->fillcolor = -1;
	parms->remap = NULL;
	parms->colorOverlay = 0;
	parms->alphaChannel = false;
	parms->flipX = false;
	parms->shadowAlpha = 0;
	parms->shadowColor = 0;
	parms->virtWidth = this->GetWidth();
	parms->virtHeight = this->GetHeight();
	parms->keepratio = false;
	parms->style.BlendOp = 255;		// Dummy "not set" value
	parms->masked = true;
	parms->bilinear = false;
	parms->specialcolormap = NULL;
	parms->colormapstyle = NULL;
	parms->cleanmode = DTA_Base;
	parms->scalex = parms->scaley = 1;
	parms->cellx = parms->celly = 0;
	parms->maxstrlen = INT_MAX;
	parms->virtBottom = false;

	// Parse the tag list for attributes. (For floating point attributes,
	// consider that the C ABI dictates that all floats be promoted to
	// doubles when passed as function arguments.)
	while (tag != TAG_DONE)
	{
		DWORD data;

		switch (tag)
		{
		default:
			data = va_arg(tags, DWORD);
			break;

		case DTA_DestWidth:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destwidth = va_arg(tags, int);
			break;

		case DTA_DestWidthF:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destwidth = va_arg(tags, double);
			break;

		case DTA_DestHeight:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destheight = va_arg(tags, int);
			break;

		case DTA_DestHeightF:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destheight = va_arg(tags, double);
			break;

		case DTA_Clean:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = 1;
				parms->scaley = 1;
				parms->cleanmode = tag;
			}
			break;

		case DTA_CleanNoMove:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = CleanXfac;
				parms->scaley = CleanYfac;
				parms->cleanmode = tag;
			}
			break;

		case DTA_CleanNoMove_1:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = CleanXfac_1;
				parms->scaley = CleanYfac_1;
				parms->cleanmode = tag;
			}
			break;

		case DTA_320x200:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->cleanmode = DTA_Base;
				parms->scalex = 1;
				parms->scaley = 1;
				parms->virtWidth = 320;
				parms->virtHeight = 200;
			}
			break;

		case DTA_Bottom320x200:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->cleanmode = DTA_Base;
				parms->scalex = 1;
				parms->scaley = 1;
				parms->virtWidth = 320;
				parms->virtHeight = 200;
			}
			parms->virtBottom = true;
			break;

		case DTA_HUDRules:
			intval = va_arg(tags, int);
			parms->cleanmode = intval == HUD_HorizCenter ? DTA_HUDRulesC : DTA_HUDRules;
			break;

		case DTA_VirtualWidth:
			parms->cleanmode = DTA_Base;
			parms->virtWidth = va_arg(tags, int);
			break;

		case DTA_VirtualWidthF:
			parms->cleanmode = DTA_Base;
			parms->virtWidth = va_arg(tags, double);
			break;
			
		case DTA_VirtualHeight:
			parms->cleanmode = DTA_Base;
			parms->virtHeight = va_arg(tags, int);
			break;

		case DTA_VirtualHeightF:
			parms->cleanmode = DTA_Base;
			parms->virtHeight = va_arg(tags, double);
			break;

		case DTA_Fullscreen:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				assert(fortext == false);
				if (img == NULL) return false;
				parms->cleanmode = DTA_Fullscreen;
				parms->virtWidth = img->GetScaledWidthDouble();
				parms->virtHeight = img->GetScaledHeightDouble();
			}
			break;

		case DTA_Alpha:
			parms->Alpha = FIXED2FLOAT(MIN<fixed_t>(OPAQUE, va_arg (tags, fixed_t)));
			break;

		case DTA_AlphaF:
			parms->Alpha = (float)(MIN<double>(1., va_arg(tags, double)));
			break;

		case DTA_AlphaChannel:
			parms->alphaChannel = va_arg(tags, INTBOOL);
			break;

		case DTA_FillColor:
			parms->fillcolor = va_arg(tags, uint32);
			fillcolorset = true;
			break;

		case DTA_Translation:
			parms->remap = va_arg(tags, FRemapTable *);
			if (parms->remap != NULL && parms->remap->Inactive)
			{ // If it's inactive, pretend we were passed NULL instead.
				parms->remap = NULL;
			}
			break;

		case DTA_ColorOverlay:
			parms->colorOverlay = va_arg(tags, DWORD);
			break;

		case DTA_FlipX:
			parms->flipX = va_arg(tags, INTBOOL);
			break;

		case DTA_TopOffset:
			assert(fortext == false);
			if (fortext) return false;
			parms->top = va_arg(tags, int);
			break;

		case DTA_TopOffsetF:
			assert(fortext == false);
			if (fortext) return false;
			parms->top = va_arg(tags, double);
			break;

		case DTA_LeftOffset:
			assert(fortext == false);
			if (fortext) return false;
			parms->left = va_arg(tags, int);
			break;

		case DTA_LeftOffsetF:
			assert(fortext == false);
			if (fortext) return false;
			parms->left = va_arg(tags, double);
			break;

		case DTA_CenterOffset:
			assert(fortext == false);
			if (fortext) return false;
			if (va_arg(tags, int))
			{
				parms->left = img->GetScaledWidthDouble() * 0.5;
				parms->top = img->GetScaledHeightDouble() * 0.5;
			}
			break;

		case DTA_CenterBottomOffset:
			assert(fortext == false);
			if (fortext) return false;
			if (va_arg(tags, int))
			{
				parms->left = img->GetScaledWidthDouble() * 0.5;
				parms->top = img->GetScaledHeightDouble();
			}
			break;

		case DTA_WindowLeft:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowleft = va_arg(tags, int);
			break;

		case DTA_WindowLeftF:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowleft = va_arg(tags, double);
			break;

		case DTA_WindowRight:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowright = va_arg(tags, int);
			break;

		case DTA_WindowRightF:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowright = va_arg(tags, double);
			break;

		case DTA_ClipTop:
			parms->uclip = va_arg(tags, int);
			if (parms->uclip < 0)
			{
				parms->uclip = 0;
			}
			break;

		case DTA_ClipBottom:
			parms->dclip = va_arg(tags, int);
			if (parms->dclip > this->GetHeight())
			{
				parms->dclip = this->GetHeight();
			}
			break;

		case DTA_ClipLeft:
			parms->lclip = va_arg(tags, int);
			if (parms->lclip < 0)
			{
				parms->lclip = 0;
			}
			break;

		case DTA_ClipRight:
			parms->rclip = va_arg(tags, int);
			if (parms->rclip > this->GetWidth())
			{
				parms->rclip = this->GetWidth();
			}
			break;

		case DTA_ShadowAlpha:
			parms->shadowAlpha = MIN<fixed_t>(OPAQUE, va_arg (tags, fixed_t));
			break;

		case DTA_ShadowColor:
			parms->shadowColor = va_arg(tags, int);
			break;

		case DTA_Shadow:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->shadowAlpha = FRACUNIT/2;
				parms->shadowColor = 0;
			}
			else
			{
				parms->shadowAlpha = 0;
			}
			break;

		case DTA_Masked:
			parms->masked = va_arg(tags, INTBOOL);
			break;

		case DTA_BilinearFilter:
			parms->bilinear = va_arg(tags, INTBOOL);
			break;

		case DTA_KeepRatio:
			// I think this is a terribly misleading name, since it actually turns
			// *off* aspect ratio correction.
			parms->keepratio = va_arg(tags, INTBOOL);
			break;

		case DTA_RenderStyle:
			parms->style.AsDWORD = va_arg(tags, DWORD);
			break;

		case DTA_SpecialColormap:
			parms->specialcolormap = va_arg(tags, FSpecialColormap *);
			break;

		case DTA_ColormapStyle:
			parms->colormapstyle = va_arg(tags, FColormapStyle *);
			break;

		case DTA_TextLen:
			parms->maxstrlen = va_arg(tags, int);
			break;

		case DTA_CellX:
			parms->cellx = va_arg(tags, int);
			break;

		case DTA_CellY:
			parms->celly = va_arg(tags, int);
			break;

		}
		tag = va_arg(tags, DWORD);
	}
	va_end (tags);

	if (parms->uclip >= parms->dclip || parms->lclip >= parms->rclip)
	{
		return false;
	}

	if (img != NULL)
	{
		SetTextureParms(parms, img, x, y);

		if (parms->destwidth <= 0 || parms->destheight <= 0)
		{
			return false;
		}
	}

	if (parms->style.BlendOp == 255)
	{
		if (fillcolorset)
		{
			if (parms->alphaChannel)
			{
				parms->style = STYLE_Shaded;
			}
			else if (parms->Alpha < 1.f)
			{
				parms->style = STYLE_TranslucentStencil;
			}
			else
			{
				parms->style = STYLE_Stencil;
			}
		}
		else if (parms->Alpha < 1.f)
		{
			parms->style = STYLE_Translucent;
		}
		else
		{
			parms->style = STYLE_Normal;
		}
	}
	return true;
}